

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_ref_t flatcc_builder_end_table(flatcc_builder_t *B)

{
  ushort vt_size_00;
  flatcc_builder_vt_ref_t vt_ref_00;
  flatbuffers_voffset_t *vt_00;
  ulong uVar1;
  flatbuffers_voffset_t *pfVar2;
  size_t tsize;
  flatbuffers_voffset_t *pl;
  int pl_count;
  flatcc_builder_ref_t vt_ref;
  flatcc_builder_ref_t table_ref;
  flatbuffers_voffset_t vt_size;
  flatbuffers_voffset_t *vt;
  flatcc_builder_t *B_local;
  
  if (B->frame->type != 3) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x53b,"flatcc_builder_ref_t flatcc_builder_end_table(flatcc_builder_t *)");
  }
  pfVar2 = B->vs;
  vt_00 = pfVar2 + -2;
  vt_size_00 = (B->id_end + 2) * 2;
  *vt_00 = vt_size_00;
  uVar1 = (ulong)B->ds_offset + 4;
  if (uVar1 < 0x10000) {
    pfVar2[-1] = (flatbuffers_voffset_t)uVar1;
    B->vt_hash = (((uint)*vt_00 ^ B->vt_hash) * -0x61c8864f ^ (uint)pfVar2[-1]) * -0x61c8864f;
    vt_ref_00 = flatcc_builder_create_cached_vtable(B,vt_00,vt_size_00,B->vt_hash);
    if (vt_ref_00 == 0) {
      B_local._4_4_ = 0;
    }
    else {
      memset(vt_00,0,(ulong)vt_size_00);
      pfVar2 = (flatbuffers_voffset_t *)
               ((long)B->buffers[3].iov_base + (ulong)(B->frame->container).table.pl_end);
      B_local._4_4_ =
           flatcc_builder_create_table
                     (B,B->ds,(ulong)B->ds_offset,B->align,pfVar2,
                      (int)((long)B->pl - (long)pfVar2 >> 1),vt_ref_00);
      if (B_local._4_4_ == 0) {
        B_local._4_4_ = 0;
      }
      else {
        B->vt_hash = (B->frame->container).table.vt_hash;
        B->id_end = (B->frame->container).table.id_end;
        B->vs = (flatbuffers_voffset_t *)
                ((long)B->buffers[0].iov_base + (ulong)(B->frame->container).table.vs_end);
        B->pl = (flatbuffers_voffset_t *)
                ((long)B->buffers[3].iov_base + (ulong)(B->frame->container).table.pl_end);
        exit_frame(B);
      }
    }
    return B_local._4_4_;
  }
  __assert_fail("tsize <= (65535)",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x54e,"flatcc_builder_ref_t flatcc_builder_end_table(flatcc_builder_t *)");
}

Assistant:

flatcc_builder_ref_t flatcc_builder_end_table(flatcc_builder_t *B)
{
    voffset_t *vt, vt_size;
    flatcc_builder_ref_t table_ref, vt_ref;
    int pl_count;
    voffset_t *pl;
    size_t tsize;

    check(frame(type) == flatcc_builder_table, "expected table frame");

    /* We have `ds_limit`, so we should not have to check for overflow here. */

    vt = B->vs - 2;
    vt_size = (voffset_t)(sizeof(voffset_t) * (B->id_end + 2u));
    /* Update vtable header fields, first vtable size, then object table size. */
    vt[0] = vt_size;
    /*
     * The `ds` buffer is always at least `field_size` aligned but excludes the
     * initial vtable offset field. Therefore `field_size` is added here
     * to the total table size in the vtable.
     */
    tsize = (size_t)(B->ds_offset + field_size);
    /*
     * Tables are limited to 64K in standard FlatBuffers format due to the voffset
     * 16 bit size, but we must also be able to store the table size, so the
     * table payload has to be slightly less than that.
     */
    check(tsize <= FLATBUFFERS_VOFFSET_MAX, "table too large"); 
    vt[1] = (voffset_t)tsize;
    FLATCC_BUILDER_UPDATE_VT_HASH(B->vt_hash, (uint32_t)vt[0], (uint32_t)vt[1]);
    /* Find already emitted vtable, or emit a new one. */
    if (!(vt_ref = flatcc_builder_create_cached_vtable(B, vt, vt_size, B->vt_hash))) {
        return 0;
    }
    /* Clear vs stack so it is ready for the next vtable (ds stack is cleared by exit frame). */
    memset(vt, 0, vt_size);

    pl = pl_ptr(frame(container.table.pl_end));
    pl_count = (int)(B->pl - pl);
    if (0 == (table_ref = flatcc_builder_create_table(B, B->ds, B->ds_offset, B->align, pl, pl_count, vt_ref))) {
        return 0;
    }
    B->vt_hash = frame(container.table.vt_hash);
    B->id_end = frame(container.table.id_end);
    B->vs = vs_ptr(frame(container.table.vs_end));
    B->pl = pl_ptr(frame(container.table.pl_end));
    exit_frame(B);
    return table_ref;
}